

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::SrcDir_abi_cxx11_(void)

{
  string *in_RDI;
  char *in_R8;
  char in_R9B;
  initializer_list<const_char_*> environment_variables;
  char *local_98;
  FilePath local_90;
  size_type local_70 [4];
  string local_50;
  FilePath argv_0;
  
  local_98 = "TEST_SRCDIR";
  internal::GetArgvs_abi_cxx11_();
  std::__cxx11::string::string((string *)&local_50,(string *)local_90.pathname_._M_dataplus._M_p);
  internal::FilePath::FilePath(&argv_0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_90);
  internal::FilePath::RemoveFileName(&local_90,&argv_0);
  std::__cxx11::string::string((string *)local_70,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&argv_0);
  environment_variables._M_len = local_70[0];
  environment_variables._M_array = (iterator)0x1;
  GetDirFromEnv_abi_cxx11_(in_RDI,(testing *)&local_98,environment_variables,in_R8,in_R9B);
  std::__cxx11::string::~string((string *)local_70);
  return in_RDI;
}

Assistant:

std::string SrcDir() {
#if defined(GTEST_CUSTOM_SRCDIR_FUNCTION_)
  return GTEST_CUSTOM_SRCDIR_FUNCTION_();
#elif defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_WINDOWS_MOBILE)
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '\\');
#elif defined(GTEST_OS_LINUX_ANDROID)
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#else
  return GetDirFromEnv({"TEST_SRCDIR"}, GetCurrentExecutableDirectory().c_str(),
                       '/');
#endif
}